

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gibbs_sampling_three.cpp
# Opt level: O2

int main(void)

{
  time_t tVar1;
  ostream *poVar2;
  ushort uVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  uint uVar8;
  double dVar9;
  double r1;
  double r2;
  double local_70;
  undefined1 local_68 [16];
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  double local_38;
  
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  dVar9 = 0.0;
  uVar3 = 1;
  iVar4 = 0;
  uVar5 = 0;
  uVar6 = 0;
  uVar7 = 0;
  uVar8 = 0;
  while( true ) {
    if (iVar4 == -10000) break;
    local_68._8_4_ = uVar7;
    local_68._0_8_ = -(double)CONCAT44(uVar6,uVar5) - dVar9;
    local_68._12_4_ = uVar8 ^ 0x80000000;
    BoxMuller(&local_70,&local_38);
    local_58 = (double)local_68._0_8_ + local_70;
    uStack_50 = local_68._8_8_;
    local_48 = local_58 * -0.5;
    uStack_40 = local_68._8_8_;
    dVar9 = dVar9 * -0.5 + local_48;
    BoxMuller(&local_70,&local_38);
    local_68._8_8_ = 0;
    local_68._0_8_ = local_70 * 0.7071067811865475 + dVar9;
    BoxMuller(&local_70,&local_38);
    dVar9 = local_70 * 0.7071067811865475;
    if ((ushort)((uVar3 / 10) * -10 + 1) == (short)iVar4) {
      poVar2 = std::ostream::_M_insert<double>(local_58);
      std::operator<<(poVar2,"  ");
      poVar2 = std::ostream::_M_insert<double>((double)local_68._0_8_);
      std::operator<<(poVar2,"  ");
      poVar2 = std::ostream::_M_insert<double>(local_58);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    dVar9 = dVar9 + local_48 + local_68._0_8_ * -0.5;
    iVar4 = iVar4 + -1;
    uVar3 = uVar3 + 1;
    uVar5 = local_68._0_4_;
    uVar6 = local_68._4_4_;
    uVar7 = local_68._8_4_;
    uVar8 = local_68._12_4_;
  }
  return 0;
}

Assistant:

int main() {
    double A[3][3];
    A[0][0] = 1e0, A[1][1] = 2e0, A[2][2] = 2e0;
    A[0][1] = 1e0, A[0][2] = 1e0, A[1][2] = 1e0;
    A[1][0] = A[0][1], A[2][0] = A[0][2], A[2][1] = A[1][2];

    srand((unsigned) time(nullptr));
    double x = 0e0, y = 0e0, z = 0e0;
    for (int iter = 0; iter < niter; iter++) {
        double sigma, mu;
        double r1, r2;

        // x更新
        sigma = 1e0 / sqrt(A[0][0]);
        mu = -A[0][1] / A[0][0] * y - A[0][2] / A[0][0] * z;
        BoxMuller(r1, r2);
        x = sigma * r1 + mu;

        // y更新
        sigma = 1e0 / sqrt(A[1][1]);
        mu = -A[1][0] / A[1][1] * x - A[1][2] / A[1][1] * z;
        BoxMuller(r1, r2);
        y = sigma * r1 + mu;

        // x更新
        sigma = 1e0 / sqrt(A[2][2]);
        mu = -A[2][0] / A[2][2] * x - A[2][1] / A[2][2] * y;
        BoxMuller(r1, r2);
        z = sigma * r1 + mu;

        if ((iter + 1) % 10 == 0) {
            std::cout << x << "  " << y << "  " << x << std::endl;
        }
    }
    return 0;
}